

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi__uint16 * stbi__convert_8_to_16(stbi_uc *orig,int w,int h,int channels)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  stbi__uint16 *enlarged;
  int img_len;
  int i;
  int local_20;
  stbi__uint16 *local_8;
  
  local_8 = (stbi__uint16 *)stbi__malloc(0x4fa005);
  if (local_8 == (stbi__uint16 *)0x0) {
    stbi__err((char *)0x0);
    local_8 = (stbi__uint16 *)0x0;
  }
  else {
    for (local_20 = 0; local_20 < in_ESI * in_EDX * in_ECX; local_20 = local_20 + 1) {
      local_8[local_20] =
           (ushort)*(byte *)((long)in_RDI + (long)local_20) * 0x100 +
           (ushort)*(byte *)((long)in_RDI + (long)local_20);
    }
    free(in_RDI);
  }
  return local_8;
}

Assistant:

static stbi__uint16 *stbi__convert_8_to_16(stbi_uc *orig, int w, int h, int channels)
{
   int i;
   int img_len = w * h * channels;
   stbi__uint16 *enlarged;

   enlarged = (stbi__uint16 *) stbi__malloc(img_len*2);
   if (enlarged == NULL) return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");

   for (i = 0; i < img_len; ++i)
      enlarged[i] = (stbi__uint16)((orig[i] << 8) + orig[i]); // replicate to high and low byte, maps 0->0, 255->0xffff

   STBI_FREE(orig);
   return enlarged;
}